

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::FileTimeSet(string *fname,cmSystemToolsFileTime *t)

{
  int iVar1;
  
  iVar1 = utime((fname->_M_dataplus)._M_p,(utimbuf *)t);
  return -1 < iVar1;
}

Assistant:

bool cmSystemTools::FileTimeSet(const std::string& fname,
                                const cmSystemToolsFileTime* t)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle h = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(fname).c_str(),
    FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return false;
  }
  return SetFileTime(h, &t->timeCreation, &t->timeLastAccess,
                     &t->timeLastWrite) != 0;
#else
  return utime(fname.c_str(), &t->timeBuf) >= 0;
#endif
}